

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_interpreter.c
# Opt level: O1

char * try_read_ld_version_string(FILE *fp)

{
  _Bool _Var1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  int i;
  char buff [256];
  char local_128 [264];
  
  lVar4 = 0;
  do {
    iVar2 = fgetc((FILE *)fp);
    if (iVar2 != (char)(&DAT_001060f1)[lVar4]) {
      return (char *)0x0;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 2);
  lVar4 = 0;
  memset(local_128,0,0x100);
  do {
    iVar2 = fgetc((FILE *)fp);
    if (iVar2 + 1U < 2) break;
    local_128[lVar4] = (char)iVar2;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x100);
  pcVar3 = strstr(local_128,".so");
  if (pcVar3 != (char *)0x0) {
    *pcVar3 = '\0';
  }
  _Var1 = is_linker_version_string_valid(local_128);
  if (_Var1) {
    pcVar3 = strdup(local_128);
  }
  else {
    pcVar3 = (char *)0x0;
  }
  return pcVar3;
}

Assistant:

char *try_read_ld_version_string(FILE *fp) {
    char glibc_version_prefix[] = "ld-";
    int c = 0;
    for (int i = 1; i < strlen(glibc_version_prefix); i++) {
        c = fgetc(fp);
        if (c != glibc_version_prefix[i])
            return 0;
    }

    char buff[256] = {0x0};
    for (int i = 0; i < 256; i++) {
        c = fgetc(fp);
        if (c == '\0' || c == -1)
            break;

        buff[i] = c;
    }

    char *suffix_idx = strstr(buff, ".so");
    if (suffix_idx)
        *suffix_idx = 0;

    if (is_linker_version_string_valid(buff))
        return strdup(buff);

    return NULL;
}